

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool TestBlockValidity(BlockValidationState *state,CChainParams *chainparams,Chainstate *chainstate,
                      CBlock *block,CBlockIndex *pindexPrev,bool fCheckPOW,bool fCheckMerkleRoot)

{
  long lVar1;
  pointer ppCVar2;
  bool bVar3;
  CBlockIndex *pCVar4;
  CCoinsViewCache *baseIn;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string local_2d8;
  CBlockIndex indexDummy;
  uint256 block_hash;
  CCoinsViewCache viewNew;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (pindexPrev == (CBlockIndex *)0x0) {
LAB_008b9fd0:
    __assert_fail("pindexPrev && pindexPrev == chainstate.m_chain.Tip()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0x1201,
                  "bool TestBlockValidity(BlockValidationState &, const CChainParams &, Chainstate &, const CBlock &, CBlockIndex *, bool, bool)"
                 );
  }
  ppCVar2 = (chainstate->m_chain).vChain.
            super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppCVar2 ==
      (chainstate->m_chain).vChain.super__Vector_base<CBlockIndex_*,_std::allocator<CBlockIndex_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    pCVar4 = (CBlockIndex *)0x0;
  }
  else {
    pCVar4 = ppCVar2[-1];
  }
  if (pCVar4 != pindexPrev) goto LAB_008b9fd0;
  baseIn = Chainstate::CoinsTip(chainstate);
  CCoinsViewCache::CCoinsViewCache(&viewNew,(CCoinsView *)baseIn,false);
  CBlockHeader::GetHash(&block_hash,&block->super_CBlockHeader);
  CBlockIndex::CBlockIndex(&indexDummy,&block->super_CBlockHeader);
  indexDummy.nHeight = pindexPrev->nHeight + 1;
  indexDummy.phashBlock = &block_hash;
  indexDummy.pprev = pindexPrev;
  bVar3 = ContextualCheckBlockHeader
                    (&block->super_CBlockHeader,state,chainstate->m_blockman,chainstate->m_chainman,
                     pindexPrev);
  if (bVar3) {
    bVar3 = CheckBlock(block,state,&chainparams->consensus,fCheckPOW,fCheckMerkleRoot);
    if (!bVar3) {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_2d8,&state->super_ValidationState<BlockValidationResult>);
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_00._M_len = 0x5e;
      logging_function_00._M_str = "TestBlockValidity";
      logging_function_00._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_00,source_file_00,0x120f,ALL,Error,
                 (ConstevalFormatString<2U>)0xcd147f,(char (*) [18])"TestBlockValidity",&local_2d8);
      goto LAB_008b9f8c;
    }
    bVar3 = ContextualCheckBlock(block,state,chainstate->m_chainman,pindexPrev);
    if (!bVar3) {
      ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                (&local_2d8,&state->super_ValidationState<BlockValidationResult>);
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_01._M_len = 0x5e;
      logging_function_01._M_str = "TestBlockValidity";
      logging_function_01._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string>
                (logging_function_01,source_file_01,0x1213,ALL,Error,
                 (ConstevalFormatString<2U>)0xcd2790,(char (*) [18])"TestBlockValidity",&local_2d8);
      goto LAB_008b9f8c;
    }
    bVar3 = Chainstate::ConnectBlock(chainstate,block,state,&indexDummy,&viewNew,true);
    if (bVar3) {
      bVar3 = true;
      if ((state->super_ValidationState<BlockValidationResult>).m_mode != M_VALID) {
        __assert_fail("state.IsValid()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1219,
                      "bool TestBlockValidity(BlockValidationState &, const CChainParams &, Chainstate &, const CBlock &, CBlockIndex *, bool, bool)"
                     );
      }
      goto LAB_008b9f98;
    }
  }
  else {
    ValidationState<BlockValidationResult>::ToString_abi_cxx11_
              (&local_2d8,&state->super_ValidationState<BlockValidationResult>);
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
    ;
    source_file._M_len = 0x5e;
    logging_function._M_str = "TestBlockValidity";
    logging_function._M_len = 0x11;
    LogPrintFormatInternal<char[18],std::__cxx11::string>
              (logging_function,source_file,0x120b,ALL,Error,(ConstevalFormatString<2U>)0xcd2761,
               (char (*) [18])"TestBlockValidity",&local_2d8);
LAB_008b9f8c:
    std::__cxx11::string::~string((string *)&local_2d8);
  }
  bVar3 = false;
LAB_008b9f98:
  CCoinsViewCache::~CCoinsViewCache(&viewNew);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool TestBlockValidity(BlockValidationState& state,
                       const CChainParams& chainparams,
                       Chainstate& chainstate,
                       const CBlock& block,
                       CBlockIndex* pindexPrev,
                       bool fCheckPOW,
                       bool fCheckMerkleRoot)
{
    AssertLockHeld(cs_main);
    assert(pindexPrev && pindexPrev == chainstate.m_chain.Tip());
    CCoinsViewCache viewNew(&chainstate.CoinsTip());
    uint256 block_hash(block.GetHash());
    CBlockIndex indexDummy(block);
    indexDummy.pprev = pindexPrev;
    indexDummy.nHeight = pindexPrev->nHeight + 1;
    indexDummy.phashBlock = &block_hash;

    // NOTE: CheckBlockHeader is called by CheckBlock
    if (!ContextualCheckBlockHeader(block, state, chainstate.m_blockman, chainstate.m_chainman, pindexPrev)) {
        LogError("%s: Consensus::ContextualCheckBlockHeader: %s\n", __func__, state.ToString());
        return false;
    }
    if (!CheckBlock(block, state, chainparams.GetConsensus(), fCheckPOW, fCheckMerkleRoot)) {
        LogError("%s: Consensus::CheckBlock: %s\n", __func__, state.ToString());
        return false;
    }
    if (!ContextualCheckBlock(block, state, chainstate.m_chainman, pindexPrev)) {
        LogError("%s: Consensus::ContextualCheckBlock: %s\n", __func__, state.ToString());
        return false;
    }
    if (!chainstate.ConnectBlock(block, state, &indexDummy, viewNew, true)) {
        return false;
    }
    assert(state.IsValid());

    return true;
}